

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O2

void __thiscall QVariantAnimation::setEasingCurve(QVariantAnimation *this,QEasingCurve *easing)

{
  QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
  *rhs;
  QVariantAnimationPrivate *this_00;
  bool bVar1;
  
  this_00 = *(QVariantAnimationPrivate **)(this + 8);
  rhs = &this_00->easing;
  QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper(rhs);
  bVar1 = ::operator!=(easing,(QEasingCurve *)rhs);
  QEasingCurve::operator=((QEasingCurve *)rhs,easing);
  QVariantAnimationPrivate::recalculateCurrentInterval(this_00,false);
  if (bVar1) {
    QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
    ::notify(rhs);
    return;
  }
  return;
}

Assistant:

void QVariantAnimation::setEasingCurve(const QEasingCurve &easing)
{
    Q_D(QVariantAnimation);
    d->easing.removeBindingUnlessInWrapper();
    const bool valueChanged = easing != d->easing.valueBypassingBindings();
    d->easing.setValueBypassingBindings(easing);
    d->recalculateCurrentInterval();
    if (valueChanged)
        d->easing.notify();
}